

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,handle *args,handle *args_1,none *args_2,str *args_3)

{
  int iVar1;
  str *in_R9;
  object local_38;
  
  iVar1 = PyGILState_Check();
  if (iVar1 != 0) {
    make_tuple<(pybind11::return_value_policy)1,pybind11::handle,pybind11::handle,pybind11::none,pybind11::str>
              ((pybind11 *)&local_38,args_1,(handle *)args_2,(none *)args_3,in_R9);
    simple_collector<(pybind11::return_value_policy)1>::call
              ((simple_collector<(pybind11::return_value_policy)1> *)this,(PyObject *)&local_38);
    object::~object(&local_38);
    return (object)(handle)this;
  }
  pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
#if !defined(NDEBUG) && PY_VERSION_HEX >= 0x03060000
    if (!PyGILState_Check()) {
        pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
    }
#endif
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}